

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

RefPtr<wabt::interp::Memory> * __thiscall
wabt::interp::Store::Alloc<wabt::interp::Memory,wabt::interp::Store&,wabt::interp::MemoryType&>
          (RefPtr<wabt::interp::Memory> *__return_storage_ptr__,Store *this,Store *args,
          MemoryType *args_1)

{
  ExternKind EVar1;
  uint64_t uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined5 uVar6;
  Memory *pMVar7;
  Ref ref;
  Memory *local_30;
  
  pMVar7 = (Memory *)operator_new(0x88);
  EVar1 = (args_1->super_ExternType).kind;
  uVar2 = (args_1->limits).initial;
  bVar3 = (args_1->limits).has_max;
  bVar4 = (args_1->limits).is_shared;
  bVar5 = (args_1->limits).is_64;
  uVar6 = *(undefined5 *)&(args_1->limits).field_0x13;
  (pMVar7->type_).limits.max = (args_1->limits).max;
  (pMVar7->type_).limits.has_max = bVar3;
  (pMVar7->type_).limits.is_shared = bVar4;
  (pMVar7->type_).limits.is_64 = bVar5;
  *(undefined5 *)&(pMVar7->type_).limits.field_0x13 = uVar6;
  (pMVar7->super_Extern).super_Object.kind_ = Memory;
  (pMVar7->super_Extern).super_Object.host_info_ = (void *)0x0;
  (pMVar7->super_Extern).super_Object.self_.index = 0;
  (pMVar7->super_Extern).super_Object.finalizer_.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (pMVar7->super_Extern).super_Object.finalizer_._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(pMVar7->super_Extern).super_Object.finalizer_.super__Function_base._M_functor = 0
  ;
  *(undefined8 *)
   ((long)&(pMVar7->super_Extern).super_Object.finalizer_.super__Function_base._M_functor + 8) = 0;
  (pMVar7->super_Extern).super_Object._vptr_Object = (_func_int **)&PTR__Memory_001eb750;
  (pMVar7->type_).super_ExternType.kind = EVar1;
  (pMVar7->type_).super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001eb920;
  (pMVar7->type_).limits.initial = uVar2;
  (pMVar7->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pMVar7->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pMVar7->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMVar7->pages_ = uVar2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&pMVar7->data_,uVar2 << 0x10);
  local_30 = pMVar7;
  ref.index = FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>
              ::New<wabt::interp::Memory*>
                        ((FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>
                          *)&this->objects_,&local_30);
  RefPtr<wabt::interp::Memory>::RefPtr(__return_storage_ptr__,this,ref);
  (__return_storage_ptr__->obj_->super_Extern).super_Object.self_.index = ref.index;
  return __return_storage_ptr__;
}

Assistant:

RefPtr<T> Store::Alloc(Args&&... args) {
  Ref ref{objects_.New(new T(std::forward<Args>(args)...))};
  RefPtr<T> ptr{*this, ref};
  ptr->self_ = ref;
  return ptr;
}